

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O2

Result<unsigned_int> * __thiscall
wasm::WATParser::ParseDefsCtx::getFieldFromIdx
          (Result<unsigned_int> *__return_storage_ptr__,ParseDefsCtx *this,HeapType type,
          uint32_t idx)

{
  bool bVar1;
  Struct *pSVar2;
  string *this_00;
  string local_98;
  string local_78;
  HeapType local_58;
  HeapType type_local;
  allocator<char> local_29;
  
  local_58.id = type.id;
  bVar1 = HeapType::isStruct(&local_58);
  if (bVar1) {
    pSVar2 = HeapType::getStruct(&local_58);
    if ((ulong)idx <
        (ulong)((long)(pSVar2->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pSVar2->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4)) {
      *(uint32_t *)
       &(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::Err> = idx;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
               super__Move_assign_alias<unsigned_int,_wasm::Err>.
               super__Copy_assign_alias<unsigned_int,_wasm::Err>.
               super__Move_ctor_alias<unsigned_int,_wasm::Err>.
               super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
               super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x20) = '\0';
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"struct index out of bounds",&local_29);
    Lexer::err((Err *)&type_local,&this->in,&local_78);
    std::__detail::__variant::_Variant_storage<false,unsigned_int,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,unsigned_int,wasm::Err> *)__return_storage_ptr__,&type_local)
    ;
    std::__cxx11::string::~string((string *)&type_local);
    this_00 = &local_78;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"expected struct type",&local_29);
    Lexer::err((Err *)&type_local,&this->in,&local_98);
    std::__detail::__variant::_Variant_storage<false,unsigned_int,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,unsigned_int,wasm::Err> *)__return_storage_ptr__,&type_local)
    ;
    std::__cxx11::string::~string((string *)&type_local);
    this_00 = &local_98;
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

Result<Index> getFieldFromIdx(HeapType type, uint32_t idx) {
    if (!type.isStruct()) {
      return in.err("expected struct type");
    }
    if (idx >= type.getStruct().fields.size()) {
      return in.err("struct index out of bounds");
    }
    return idx;
  }